

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6b36e::ParseCommandActions::actOnBindingDecl
          (ParseCommandActions *this,Token *name,Token *value)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"actOnBindingDecl");
  poVar1 = std::operator<<(poVar1,"(/*Name=*/");
  poVar1 = std::operator<<(poVar1,"\"");
  escapedString_abi_cxx11_(&local_40,name);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"\", ");
  poVar1 = std::operator<<(poVar1,"/*Value=*/\"");
  escapedString_abi_cxx11_(&local_60,value);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void actOnBindingDecl(const ninja::Token& name,
                                const ninja::Token& value) override {
    std::cerr << __FUNCTION__ << "(/*Name=*/"
              << "\"" << escapedString(name) << "\", "
              << "/*Value=*/\"" << escapedString(value) << "\")\n";
  }